

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llex.c
# Opt level: O3

char * luaX_token2str(LexState *ls,int token)

{
  char *pcVar1;
  
  if (0x100 < token) {
    if ((uint)token < 0x122) {
      pcVar1 = luaO_pushfstring(ls->L,"\'%s\'",luaX_tokens[token - 0x101]);
      return pcVar1;
    }
    return luaX_tokens[token - 0x101];
  }
  if ((uint)token < 0x100) {
    if ((""[(ulong)(uint)token + 1] & 4) == 0) {
      pcVar1 = "\'<\\%d>\'";
    }
    else {
      pcVar1 = "\'%c\'";
    }
    pcVar1 = luaO_pushfstring(ls->L,pcVar1);
    return pcVar1;
  }
  __assert_fail("token == ((unsigned char)((token)))",
                "/workspace/llm4binary/github/license_c_cmakelists/dibyendumajumdar[P]ravi/src/llex.c"
                ,0x5a,"const char *luaX_token2str(LexState *, int)");
}

Assistant:

const char *luaX_token2str (LexState *ls, int token) {
  if (token < FIRST_RESERVED) {  /* single-byte symbols? */
    lua_assert(token == cast_uchar(token));
    if (lisprint(token))
      return luaO_pushfstring(ls->L, "'%c'", token);
    else  /* control character */
      return luaO_pushfstring(ls->L, "'<\\%d>'", token);
  }
  else {
    const char *s = luaX_tokens[token - FIRST_RESERVED];
    if (token < TK_EOS)  /* fixed format (symbols and reserved words)? */
      return luaO_pushfstring(ls->L, "'%s'", s);
    else  /* names, strings, and numerals */
      return s;
  }
}